

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::setReversedStereoEnabled(QSynth *this,bool enabled)

{
  QMutexLocker<QMutex> synthLocker;
  QMutexLocker<QMutex> local_20;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setReversedStereoEnabled(this->realtimeHelper,enabled);
    return;
  }
  QMutexLocker<QMutex>::QMutexLocker(&local_20,this->synthMutex);
  if (this->state == SynthState_OPEN) {
    MT32Emu::Synth::setReversedStereoEnabled(this->synth,enabled);
  }
  QMutexLocker<QMutex>::unlock(&local_20);
  return;
}

Assistant:

void QSynth::setReversedStereoEnabled(bool enabled) {
	if (isRealtime()) {
		realtimeHelper->setReversedStereoEnabled(enabled);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) synth->setReversedStereoEnabled(enabled);
	}
}